

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O0

void removeMesh(aiScene *pScene,uint index)

{
  aiMesh *this;
  uint local_24;
  uint i;
  aiMesh *delete_me;
  uint index_local;
  aiScene *pScene_local;
  
  this = pScene->mMeshes[index];
  for (local_24 = index; local_24 < pScene->mNumMeshes - 1; local_24 = local_24 + 1) {
    pScene->mMeshes[local_24] = pScene->mMeshes[local_24 + 1];
  }
  pScene->mMeshes[pScene->mNumMeshes - 1] = (aiMesh *)0x0;
  pScene->mNumMeshes = pScene->mNumMeshes - 1;
  if (this != (aiMesh *)0x0) {
    aiMesh::~aiMesh(this);
    operator_delete(this);
  }
  updateSceneGraph(pScene->mRootNode,index);
  return;
}

Assistant:

static void removeMesh(aiScene* pScene, unsigned const index) {
    //we start at index and copy the pointers one position forward
    //save the mesh pointer to delete it later
    auto delete_me = pScene->mMeshes[index];
    for (unsigned i = index; i < pScene->mNumMeshes - 1; ++i) {
        pScene->mMeshes[i] = pScene->mMeshes[i+1];
    }
    pScene->mMeshes[pScene->mNumMeshes - 1] = nullptr;
    --(pScene->mNumMeshes);
    delete delete_me;

    //removing a mesh also requires updating all references to it in the scene graph
    updateSceneGraph(pScene->mRootNode, index);
}